

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleValueHashTableOf.hpp
# Opt level: O3

void __thiscall
SimpleValueHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::removeBucketElem
          (SimpleValueHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher> *this,void *key,
          XMLSize_t *hashVal)

{
  NoSuchElementException *this_00;
  ValueHashTableBucketElem<unsigned_int> *pVVar1;
  ulong uVar2;
  ValueHashTableBucketElem<unsigned_int> **ppVVar3;
  pointer_____offset_0x10___ *ppuVar4;
  ValueHashTableBucketElem<unsigned_int> *pVVar5;
  
  uVar2 = (ulong)key % this->fHashModulus;
  *hashVal = uVar2;
  if (this->fHashModulus < uVar2) {
    this_00 = (NoSuchElementException *)__cxa_allocate_exception(0x30);
    xercesc_4_0::RuntimeException::RuntimeException
              ((RuntimeException *)this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/tests/src/MemHandlerTest/SimpleValueHashTableOf.hpp"
               ,0x18b,HshTbl_BadHashFromKey,(MemoryManager *)0x0);
    ppuVar4 = &xercesc_4_0::RuntimeException::typeinfo;
  }
  else {
    pVVar5 = this->fBucketList[uVar2];
    if (pVVar5 != (ValueHashTableBucketElem<unsigned_int> *)0x0) {
      if (pVVar5->fKey == key) {
        pVVar1 = (ValueHashTableBucketElem<unsigned_int> *)0x0;
      }
      else {
        do {
          pVVar1 = pVVar5;
          pVVar5 = pVVar1->fNext;
          if (pVVar5 == (ValueHashTableBucketElem<unsigned_int> *)0x0) goto LAB_00105e9a;
        } while (pVVar5->fKey != key);
      }
      ppVVar3 = &pVVar1->fNext;
      if (pVVar1 == (ValueHashTableBucketElem<unsigned_int> *)0x0) {
        ppVVar3 = this->fBucketList + uVar2;
      }
      *ppVVar3 = pVVar5->fNext;
      operator_delete(pVVar5,0x18);
      return;
    }
LAB_00105e9a:
    this_00 = (NoSuchElementException *)__cxa_allocate_exception(0x30);
    xercesc_4_0::NoSuchElementException::NoSuchElementException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/tests/src/MemHandlerTest/SimpleValueHashTableOf.hpp"
               ,0x1af,HshTbl_NoSuchKeyExists,(MemoryManager *)0x0);
    ppuVar4 = &xercesc_4_0::NoSuchElementException::typeinfo;
  }
  __cxa_throw(this_00,ppuVar4,xercesc_4_0::XMLException::~XMLException);
}

Assistant:

void SimpleValueHashTableOf<TVal, THasher>::
removeBucketElem(const void* const key, XMLSize_t& hashVal)
{
    // Hash the key
    hashVal = fHasher.getHashVal(key, fHashModulus);
    if (hashVal > fHashModulus)
        ThrowXML(RuntimeException, XMLExcepts::HshTbl_BadHashFromKey);

    //
    //  Search the given bucket for this key. Keep up with the previous
    //  element so we can patch around it.
    //
    ValueHashTableBucketElem<TVal>* curElem = fBucketList[hashVal];
    ValueHashTableBucketElem<TVal>* lastElem = 0;

    while (curElem)
    {
        if (fHasher.equals(key, curElem->fKey))
        {
            if (!lastElem)
            {
                // It was the first in the bucket
                fBucketList[hashVal] = curElem->fNext;
            }
             else
            {
                // Patch around the current element
                lastElem->fNext = curElem->fNext;
            }

            // Delete the current element
            delete curElem;

            return;
        }

        // Move both pointers upwards
        lastElem = curElem;
        curElem = curElem->fNext;
    }

    // We never found that key
    ThrowXML(NoSuchElementException, XMLExcepts::HshTbl_NoSuchKeyExists);
}